

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_traverse_flatten
               (plutovg_path_t *path,plutovg_path_traverse_func_t traverse_func,void *closure)

{
  _Bool _Var1;
  plutovg_path_command_t pVar2;
  float fVar3;
  float fVar4;
  plutovg_point_t local_488;
  plutovg_point_t p;
  float d;
  float l;
  float x4x1;
  float y4y1;
  bezier_t *b;
  float fStack_460;
  plutovg_path_command_t command;
  plutovg_point_t current_point;
  plutovg_point_t points [3];
  undefined1 local_438 [8];
  bezier_t beziers [32];
  plutovg_path_iterator_t it;
  float threshold;
  void *closure_local;
  plutovg_path_traverse_func_t traverse_func_local;
  plutovg_path_t *path_local;
  
  if (path->num_curves == 0) {
    plutovg_path_traverse(path,traverse_func,closure);
  }
  else {
    plutovg_path_iterator_init((plutovg_path_iterator_t *)&beziers[0x1f].x4,path);
    memset(&stack0xfffffffffffffba0,0,8);
    while (_Var1 = plutovg_path_iterator_has_next((plutovg_path_iterator_t *)&beziers[0x1f].x4),
          _Var1) {
      pVar2 = plutovg_path_iterator_next
                        ((plutovg_path_iterator_t *)&beziers[0x1f].x4,&current_point);
      if (pVar2 < PLUTOVG_PATH_COMMAND_CUBIC_TO) {
LAB_0011827d:
        (*traverse_func)(closure,pVar2,&current_point,1);
        _fStack_460 = CONCAT44(current_point.y,current_point.x);
      }
      else if (pVar2 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
        local_438._0_4_ = fStack_460;
        local_438._4_4_ = command;
        beziers[0].x1 = current_point.x;
        beziers[0].y1 = current_point.y;
        _x4x1 = (bezier_t *)local_438;
        while ((bezier_t *)local_438 <= _x4x1) {
          fVar3 = _x4x1->y4 - _x4x1->y1;
          fVar4 = _x4x1->x4 - _x4x1->x1;
          p.y = ABS(fVar4) + ABS(fVar3);
          if (p.y <= 1.0) {
            p.x = ABS(_x4x1->x1 - _x4x1->x2) + ABS(_x4x1->y1 - _x4x1->y2) +
                  ABS(_x4x1->x1 - _x4x1->x3) + ABS(_x4x1->y1 - _x4x1->y3);
            p.y = 1.0;
          }
          else {
            p.x = ABS(fVar4 * (_x4x1->y1 - _x4x1->y2) + -(fVar3 * (_x4x1->x1 - _x4x1->x2))) +
                  ABS(fVar4 * (_x4x1->y1 - _x4x1->y3) + -(fVar3 * (_x4x1->x1 - _x4x1->x3)));
          }
          if ((p.x < p.y * 0.25) || (_x4x1 == (bezier_t *)&beziers[0x1e].x4)) {
            local_488.x = _x4x1->x4;
            local_488.y = _x4x1->y4;
            (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_LINE_TO,&local_488,1);
            _x4x1 = _x4x1 + -1;
          }
          else {
            split_bezier(_x4x1,_x4x1 + 1,_x4x1);
            _x4x1 = _x4x1 + 1;
          }
        }
        _fStack_460 = CONCAT44(points[1].y,points[1].x);
      }
      else if (pVar2 == PLUTOVG_PATH_COMMAND_CLOSE) goto LAB_0011827d;
    }
  }
  return;
}

Assistant:

void plutovg_path_traverse_flatten(const plutovg_path_t* path, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    if(path->num_curves == 0) {
        plutovg_path_traverse(path, traverse_func, closure);
        return;
    }

    const float threshold = 0.25f;

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    bezier_t beziers[32];
    plutovg_point_t points[3];
    plutovg_point_t current_point = {0, 0};
    while(plutovg_path_iterator_has_next(&it)) {
        plutovg_path_command_t command = plutovg_path_iterator_next(&it, points);
        switch(command) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
        case PLUTOVG_PATH_COMMAND_LINE_TO:
        case PLUTOVG_PATH_COMMAND_CLOSE:
            traverse_func(closure, command, points, 1);
            current_point = points[0];
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            beziers[0].x1 = current_point.x;
            beziers[0].y1 = current_point.y;
            beziers[0].x2 = points[0].x;
            beziers[0].y2 = points[0].y;
            beziers[0].x3 = points[1].x;
            beziers[0].y3 = points[1].y;
            beziers[0].x4 = points[2].x;
            beziers[0].y4 = points[2].y;
            bezier_t* b = beziers;
            while(b >= beziers) {
                float y4y1 = b->y4 - b->y1;
                float x4x1 = b->x4 - b->x1;
                float l = fabsf(x4x1) + fabsf(y4y1);
                float d;
                if(l > 1.f) {
                    d = fabsf((x4x1)*(b->y1 - b->y2) - (y4y1)*(b->x1 - b->x2)) + fabsf((x4x1)*(b->y1 - b->y3) - (y4y1)*(b->x1 - b->x3));
                } else {
                    d = fabsf(b->x1 - b->x2) + fabsf(b->y1 - b->y2) + fabsf(b->x1 - b->x3) + fabsf(b->y1 - b->y3);
                    l = 1.f;
                }

                if(d < threshold*l || b == beziers + 31) {
                    plutovg_point_t p = { b->x4, b->y4 };
                    traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p, 1);
                    --b;
                } else {
                    split_bezier(b, b + 1, b);
                    ++b;
                }
            }

            current_point = points[2];
            break;
        }
    }
}